

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShadersIsolines::countIsolines
          (TessellationShadersIsolines *this,_test_result *test_result)

{
  pointer pfVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float vertex_y;
  vector<float,_std::allocator<float>_> found_ys;
  float local_3c;
  _Vector_base<float,_std::allocator<float>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (float *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0;
  do {
    if (test_result->n_vertices <= uVar2) {
      test_result->n_isolines =
           (uint)((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_38._M_impl.super__Vector_impl_data._M_start) >> 2);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_38);
      return;
    }
    local_3c = (test_result->rendered_data).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start[(ulong)(uint)((int)uVar2 * 3) + 1];
    pfVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pfVar1 == local_38._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_38,&local_3c);
        break;
      }
      fVar3 = local_3c - *pfVar1;
      fVar4 = -fVar3;
      if (-fVar3 <= fVar3) {
        fVar4 = fVar3;
      }
      pfVar1 = pfVar1 + 1;
    } while (1e-05 <= fVar4);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void TessellationShadersIsolines::countIsolines(_test_result& test_result)
{
	const float		   epsilon = 1e-5f;
	std::vector<float> found_ys;

	for (unsigned int n_vertex = 0; n_vertex < test_result.n_vertices; ++n_vertex)
	{
		bool		 was_y_found = false;
		const float* vertex		 = (&test_result.rendered_data[0]) + n_vertex * 3; /* components */
		float		 vertex_y	= vertex[1];

		for (std::vector<float>::iterator found_ys_iterator = found_ys.begin(); found_ys_iterator != found_ys.end();
			 found_ys_iterator++)
		{
			float& found_y = *found_ys_iterator;

			if (de::abs(vertex_y - found_y) < epsilon)
			{
				was_y_found = true;

				break;
			}
		} /* for (all found Ys) */

		if (!was_y_found)
		{
			found_ys.push_back(vertex_y);
		}
	} /* for (all vertices) */

	/* Store the value */
	test_result.n_isolines = (unsigned int)found_ys.size();
}